

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

void __thiscall hdc::Lex::Lex(Lex *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Elt_pointer piVar3;
  mapped_type *pmVar4;
  key_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  (this->blockStack).c.super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->blockStack).c.super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->blockStack).c.super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->blockStack).c.super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->blockStack).c.super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->blockStack).c.super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->blockStack).c.super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->blockStack).c.super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->blockStack).c.super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->blockStack).c.super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>::_M_initialize_map
            ((_Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_> *)&this->blockStack,0);
  local_38 = &(this->buffer).field_2;
  (this->buffer)._M_dataplus._M_p = (pointer)local_38;
  (this->buffer)._M_string_length = 0;
  (this->buffer).field_2._M_local_buf[0] = '\0';
  (this->tokens).super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokens).super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokens).super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->indentationStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->indentationStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->indentationStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->indentationStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->indentationStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->indentationStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->indentationStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->indentationStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->indentationStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->indentationStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)&this->indentationStack,0);
  this_00 = &this->keywordsMap;
  p_Var1 = &(this->keywordsMap)._M_t._M_impl.super__Rb_tree_header;
  (this->keywordsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->keywordsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->keywordsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->keywordsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->keywordsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = &this->operatorMap;
  p_Var1 = &(this->operatorMap)._M_t._M_impl.super__Rb_tree_header;
  (this->operatorMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->operatorMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->operatorMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->operatorMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->operatorMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->row = 1;
  this->column = 1;
  this->idx = 0;
  this->lexemBegin = 0;
  this->lexemEnd = 0;
  this->hasLexem = false;
  this->newline = true;
  local_58._M_dataplus._M_p = (pointer)((ulong)local_58._M_dataplus._M_p._4_4_ << 0x20);
  piVar3 = (this->indentationStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (this->indentationStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,_std::allocator<int>_>::_M_push_back_aux<int>
              (&(this->indentationStack).c,(int *)&local_58);
  }
  else {
    *piVar3 = 0;
    (this->indentationStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = piVar3 + 1;
  }
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"def","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_DEF;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"class","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_CLASS;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"var","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_VAR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"const","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_CONSTANT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"constant","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_CONSTANT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"struct","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_STRUCT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"enum","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_ENUM;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"union","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_UNION;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"new","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_NEW;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"delete","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_DELETE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"case","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_CASE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"default","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_DEFAULT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"with","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_WITH;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"pass","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_PASS;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"do","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_DO;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"from","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_FROM;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"sizeof","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_SIZEOF;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"import","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_IMPORT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"as","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_AS;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"in","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_IN;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"null","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_NULL;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"true","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_TRUE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"false","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_FALSE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"if","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_IF;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"elif","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_ELIF;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"else","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_ELSE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"for","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_FOR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"while","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_WHILE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"break","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_BREAK;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"continue","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_CONTINUE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"goto","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_GOTO;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"yield","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_YIELD;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"return","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_RETURN;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"and","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_AND;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"or","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_OR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"not","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_NOT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"u8","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_U8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"u16","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_U16;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"u32","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_U32;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"u64","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_U64;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"i8","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_I8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"i16","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_I16;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"i32","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_I32;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"i64","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_I64;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"void","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_VOID;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"symbol","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_SYMBOL;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"bool","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_BOOL;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"uchar","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_UCHAR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"char","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_CHAR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ushort","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_USHORT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"short","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_SHORT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"uint","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_UINT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"int","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_INT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ulong","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_ULONG;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"long","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_LONG;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"float","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_FLOAT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"double","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_00,&local_58);
  *pmVar4 = TK_DOUBLE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"++","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_INC;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_DEC;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"+","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_PLUS;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_MINUS;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"*","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_TIMES;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"/","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_DIVISION;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"//","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_INTEGER_DIVISION;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"%","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_MODULO;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"**","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_POWER;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"==","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_EQ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"!=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_NE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,">","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_GT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"<","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_LT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,">=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_GE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"<=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_LE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"&","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_BITWISE_AND;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"|","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_BITWISE_OR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"^","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_BITWISE_XOR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"~","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_BITWISE_NOT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"<<","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_SLL;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,">>","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_SRA;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,">>>","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_SRL;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"&&","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_LOGICAL_AND;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"||","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_LOGICAL_OR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"!","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_LOGICAL_NOT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"->","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_ARROW;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,".","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_DOT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"::","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_SCOPE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"$","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_DOLAR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"..","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_INCLUSIVE_RANGE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"...","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_EXCLUSIVE_RANGE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"?","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_TERNARY;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"=>","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_HASH_ARROW;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"&=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_BITWISE_AND_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"^=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_BITWISE_XOR_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"|=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_BITWISE_OR_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"~=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_BITWISE_NOT_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"/=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_DIVISION_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"//=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_INTEGER_DIVISION_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_MINUS_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"%=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_MODULO_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"+=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_PLUS_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"*=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_TIMES_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"<<=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_SLL_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,">>=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_SRA_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,">>>=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_SRL_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,":=","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_SPECIAL_ASSIGNMENT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"@","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_AT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,":","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_COLON;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,",","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_COMMA;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,";","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_SEMICOLON;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"(","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_LEFT_PARENTHESIS;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,")","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_RIGHT_PARENTHESIS;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"[","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_LEFT_SQUARE_BRACKET;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"]","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_RIGHT_SQUARE_BRACKET;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"{","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_LEFT_CURLY_BRACKET;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"}","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](this_01,&local_58);
  *pmVar4 = TK_RIGHT_CURLY_BRACKET;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

Lex::Lex() {
    this->row = 1;
    this->column = 1;
    this->idx = 0;
    this->lexemBegin = 0;
    this->lexemEnd = 0;
    this->newline = true;
    this->hasLexem = false;
    this->indentationStack.push(0);

    if (true) {
        keywordsMap["def"] = TK_DEF;
        keywordsMap["class"] = TK_CLASS;
        keywordsMap["var"] = TK_VAR;
        keywordsMap["const"] = TK_CONSTANT;
        keywordsMap["constant"] = TK_CONSTANT;

        keywordsMap["struct"] = TK_STRUCT;
        keywordsMap["enum"] = TK_ENUM;
        keywordsMap["union"] = TK_UNION;

        keywordsMap["new"] = TK_NEW;
        keywordsMap["delete"] = TK_DELETE;
        keywordsMap["case"] = TK_CASE;
        keywordsMap["default"] = TK_DEFAULT;
        keywordsMap["with"] = TK_WITH;
        keywordsMap["pass"] = TK_PASS;
        keywordsMap["do"] = TK_DO;
        keywordsMap["from"] = TK_FROM;
        keywordsMap["sizeof"] = TK_SIZEOF;

        keywordsMap["import"] = TK_IMPORT;
        keywordsMap["as"] = TK_AS;
        keywordsMap["in"] = TK_IN;
        keywordsMap["null"] = TK_NULL;
        keywordsMap["true"] = TK_TRUE;
        keywordsMap["false"] = TK_FALSE;

        keywordsMap["if"] = TK_IF;
        keywordsMap["elif"] = TK_ELIF;
        keywordsMap["else"] = TK_ELSE;

        keywordsMap["for"] = TK_FOR;
        keywordsMap["while"] = TK_WHILE;

        keywordsMap["break"] = TK_BREAK;
        keywordsMap["continue"] = TK_CONTINUE;
        keywordsMap["goto"] = TK_GOTO;
        keywordsMap["yield"] = TK_YIELD;
        keywordsMap["return"] = TK_RETURN;

        keywordsMap["and"] = TK_AND;
        keywordsMap["or"] = TK_OR;
        keywordsMap["not"] = TK_NOT;

        /* types */
        keywordsMap["u8"] = TK_U8;
        keywordsMap["u16"] = TK_U16;
        keywordsMap["u32"] = TK_U32;
        keywordsMap["u64"] = TK_U64;

        keywordsMap["i8"] = TK_I8;
        keywordsMap["i16"] = TK_I16;
        keywordsMap["i32"] = TK_I32;
        keywordsMap["i64"] = TK_I64;

        keywordsMap["void"] = TK_VOID;
        keywordsMap["symbol"] = TK_SYMBOL;
        keywordsMap["bool"] = TK_BOOL;
        keywordsMap["uchar"] = TK_UCHAR;
        keywordsMap["char"] = TK_CHAR;
        keywordsMap["ushort"] = TK_USHORT;
        keywordsMap["short"] = TK_SHORT;
        keywordsMap["uint"] = TK_UINT;
        keywordsMap["int"] = TK_INT;
        keywordsMap["ulong"] = TK_ULONG;
        keywordsMap["long"] = TK_LONG;
        keywordsMap["float"] = TK_FLOAT;
        keywordsMap["double"] = TK_DOUBLE;


        /* operators */

        /* increment and decrement */
        operatorMap["++"] = TK_INC;
        operatorMap["--"] = TK_DEC;

        /* arithmetic */
        operatorMap["+"] = TK_PLUS;
        operatorMap["-"] = TK_MINUS;
        operatorMap["*"] = TK_TIMES;
        operatorMap["/"] = TK_DIVISION;
        operatorMap["//"] = TK_INTEGER_DIVISION;
        operatorMap["%"] = TK_MODULO;
        operatorMap["**"] = TK_POWER;

        /* relational */
        operatorMap["=="] = TK_EQ;
        operatorMap["!="] = TK_NE;
        operatorMap[">"] = TK_GT;
        operatorMap["<"] = TK_LT;
        operatorMap[">="] = TK_GE;
        operatorMap["<="] = TK_LE;

        /* bitwise */
        operatorMap["&"] = TK_BITWISE_AND;
        operatorMap["|"] = TK_BITWISE_OR;
        operatorMap["^"] = TK_BITWISE_XOR;
        operatorMap["~"] = TK_BITWISE_NOT;
        operatorMap["<<"] = TK_SLL;
        operatorMap[">>"] = TK_SRA;
        operatorMap[">>>"] = TK_SRL;

        /* logical */
        operatorMap["&&"] = TK_LOGICAL_AND;
        operatorMap["||"] = TK_LOGICAL_OR;
        operatorMap["!"] = TK_LOGICAL_NOT;

        /* member access */
        operatorMap["->"] = TK_ARROW;
        operatorMap["."] = TK_DOT;

        /* scope */
        operatorMap["::"] = TK_SCOPE;
        operatorMap["$"] = TK_DOLAR;

        /* ranges */
        operatorMap[".."] = TK_INCLUSIVE_RANGE;
        operatorMap["..."] = TK_EXCLUSIVE_RANGE;

        /* ternary */
        operatorMap["?"] = TK_TERNARY;

        /* hash arrow*/
        operatorMap["=>"] = TK_HASH_ARROW;

        /* assignments */
        operatorMap["="] = TK_ASSIGNMENT;
        operatorMap["&="] = TK_BITWISE_AND_ASSIGNMENT;
        operatorMap["^="] = TK_BITWISE_XOR_ASSIGNMENT;
        operatorMap["|="] = TK_BITWISE_OR_ASSIGNMENT;
        operatorMap["~="] = TK_BITWISE_NOT_ASSIGNMENT;
        operatorMap["/="] = TK_DIVISION_ASSIGNMENT;
        operatorMap["//="] = TK_INTEGER_DIVISION_ASSIGNMENT;
        operatorMap["-="] = TK_MINUS_ASSIGNMENT;
        operatorMap["%="] = TK_MODULO_ASSIGNMENT;
        operatorMap["+="] = TK_PLUS_ASSIGNMENT;
        operatorMap["*="] = TK_TIMES_ASSIGNMENT;
        operatorMap["<<="] = TK_SLL_ASSIGNMENT;
        operatorMap[">>="] = TK_SRA_ASSIGNMENT;
        operatorMap[">>>="] = TK_SRL_ASSIGNMENT;
        operatorMap[":="] = TK_SPECIAL_ASSIGNMENT;

        /* punctuation */
        operatorMap["@"] = TK_AT;
        operatorMap[":"] = TK_COLON;
        operatorMap[","] = TK_COMMA;
        operatorMap[";"] = TK_SEMICOLON;
        operatorMap["("] = TK_LEFT_PARENTHESIS;
        operatorMap[")"] = TK_RIGHT_PARENTHESIS;
        operatorMap["["] = TK_LEFT_SQUARE_BRACKET;
        operatorMap["]"] = TK_RIGHT_SQUARE_BRACKET;
        operatorMap["{"] = TK_LEFT_CURLY_BRACKET;
        operatorMap["}"] = TK_RIGHT_CURLY_BRACKET;
    }
}